

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = comp->nbState;
  uVar7 = 0;
  uVar3 = 0;
  if (0 < (int)uVar5) {
    uVar3 = (ulong)uVar5;
  }
  for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    piVar4 = comp->states;
    if (piVar4[uVar7 * 2] < 0) {
      piVar4[uVar7 * 2] = idx;
      piVar4[uVar7 * 2 + 1] = level;
      goto LAB_0016ea01;
    }
  }
  uVar1 = comp->maxState;
  if ((int)uVar5 < (int)uVar1) {
    piVar4 = comp->states;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    if ((int)uVar1 < 1) {
      uVar5 = 4;
    }
    else {
      if (999999999 < uVar1) goto LAB_0016ea01;
      uVar6 = uVar1 + 1 >> 1;
      uVar5 = uVar6 + uVar1;
      if (1000000000 - uVar6 < uVar1) {
        uVar5 = 1000000000;
      }
    }
    piVar4 = (int *)(*xmlRealloc)(comp->states,(ulong)uVar5 << 3);
    if (piVar4 == (int *)0x0) goto LAB_0016ea01;
    comp->states = piVar4;
    comp->maxState = uVar5;
    uVar5 = comp->nbState;
  }
  piVar4[(int)(uVar5 * 2)] = idx;
  iVar2 = comp->nbState;
  comp->nbState = iVar2 + 1;
  piVar4[(long)iVar2 * 2 + 1] = level;
  uVar7 = (ulong)(comp->nbState - 1);
LAB_0016ea01:
  return (int)uVar7;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxState, sizeof(tmp[0]) * 2,
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: growCapacity failed\n");
	    return(-1);
        }
	tmp = xmlRealloc(comp->states, newSize * sizeof(tmp[0]) * 2);
	if (tmp == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = tmp;
        comp->maxState = newSize;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}